

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::Quantity<long,kj::_::NanosecondLabel>const&>
          (String *__return_storage_ptr__,kj *this,Quantity<long,_kj::_::NanosecondLabel> *params)

{
  String *result;
  char *__dest;
  size_t local_38;
  undefined1 local_30 [32];
  
  operator*(&local_38,*(undefined8 *)this);
  heapString(__return_storage_ptr__,local_38);
  if (local_38 != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,local_30,local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}